

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::SetKnot(ON_NurbsCage *this,int dir,int knot_index,double knot_value)

{
  bool local_21;
  bool rc;
  double knot_value_local;
  int knot_index_local;
  int dir_local;
  ON_NurbsCage *this_local;
  
  if ((((dir < 0) || (2 < dir)) || (this->m_knot[dir] == (double *)0x0)) ||
     ((knot_index < 0 || (this->m_order[dir] + this->m_cv_count[dir] + -2 <= knot_index)))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
               ,0x6ee,"","ON_NurbsCage::SetKnot - invalid input parameters");
    local_21 = false;
  }
  else {
    this->m_knot[dir][knot_index] = knot_value;
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool ON_NurbsCage::SetKnot(
      int dir,
      int knot_index,
      double knot_value
      )
{
  bool rc;

  // Validate input so invalid input does not crash Rhino.
  // Expert programmers who want to write fast code can directly
  // access the m_knot[] arrays.
  if (    dir >= 0 && dir < 3 
       && 0 != m_knot[dir]
       && knot_index >= 0 
       && knot_index < m_order[dir]+m_cv_count[dir]-2
     )
  {
    m_knot[dir][knot_index] = knot_value;
    rc = true;
  }
  else
  {
    ON_ERROR("ON_NurbsCage::SetKnot - invalid input parameters");
    rc = false;
  }
  return rc;
}